

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O0

void __thiscall cppcms::impl::cgi::http::on_async_write_progress(http *this,bool completed)

{
  element_type *this_00;
  byte in_SIL;
  http *in_RDI;
  shared_ptr<cppcms::impl::cgi::http> *in_stack_ffffffffffffff98;
  http *in_stack_ffffffffffffffa0;
  weak_ptr<cppcms::impl::cgi::http> *this_01;
  weak_ptr<cppcms::impl::cgi::http> local_30;
  char local_20 [23];
  byte local_9;
  
  local_9 = in_SIL & 1;
  update_time(in_stack_ffffffffffffffa0);
  if ((local_9 & 1) != 0) {
    this_00 = std::
              __shared_ptr_access<cppcms::impl::cgi::http_watchdog,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cppcms::impl::cgi::http_watchdog,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x49892d);
    this_01 = &local_30;
    self(in_RDI);
    std::weak_ptr<cppcms::impl::cgi::http>::weak_ptr<cppcms::impl::cgi::http,void>
              (this_01,in_stack_ffffffffffffff98);
    http_watchdog::remove(this_00,local_20);
    std::weak_ptr<cppcms::impl::cgi::http>::~weak_ptr((weak_ptr<cppcms::impl::cgi::http> *)0x498975)
    ;
    std::shared_ptr<cppcms::impl::cgi::http>::~shared_ptr
              ((shared_ptr<cppcms::impl::cgi::http> *)0x49897f);
  }
  return;
}

Assistant:

void on_async_write_progress(bool completed)
		{
			update_time();
			if(completed)
				watchdog_->remove(self());
		}